

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

Ver_Bundle_t * Ver_ParseGetNondrivenBundle(Abc_Ntk_t *pNtk,int Counter)

{
  Ver_Bundle_t *pVVar1;
  int iVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  
  pvVar3 = pNtk->pData;
  if (0 < *(int *)((long)pvVar3 + 4)) {
    lVar6 = 0;
    do {
      lVar7 = *(long *)(*(long *)(*(long *)((long)pvVar3 + 8) + lVar6 * 8) + 0x40);
      iVar2 = *(int *)(lVar7 + 4);
      if (Counter < iVar2) {
        uVar5 = iVar2 + ~Counter;
        if (((int)uVar5 < 0) || (iVar2 <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pVVar1 = *(Ver_Bundle_t **)(*(long *)(lVar7 + 8) + (ulong)uVar5 * 8);
        if ((pVVar1 != (Ver_Bundle_t *)0x0) && (pVVar4 = pVVar1->vNetsActual, 0 < pVVar4->nSize)) {
          lVar7 = 0;
          do {
            if (*(int *)((long)pVVar4->pArray[lVar7] + 0x1c) == 0) {
              iVar2 = Ver_ParseFormalNetsAreDriven(pNtk,pVVar1->pNameFormal);
              if (iVar2 == 0) {
                return pVVar1;
              }
              pVVar4 = pVVar1->vNetsActual;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < pVVar4->nSize);
          pvVar3 = pNtk->pData;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)((long)pvVar3 + 4));
  }
  return (Ver_Bundle_t *)0x0;
}

Assistant:

Ver_Bundle_t * Ver_ParseGetNondrivenBundle( Abc_Ntk_t * pNtk, int Counter )
{
    Ver_Bundle_t * pBundle;
    Abc_Obj_t * pBox, * pNet;
    int k, m;
    // go through instances of this type
    Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
    {
        if ( Counter >= Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) )
            continue;
        // get the bundle given distance away
        pBundle = (Ver_Bundle_t *)Vec_PtrEntry( (Vec_Ptr_t *)pBox->pCopy, Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) - 1 - Counter );
        if ( pBundle == NULL )
            continue;
        // go through the actual nets of this bundle
        Vec_PtrForEachEntry( Abc_Obj_t *, pBundle->vNetsActual, pNet, m )
            if ( !Abc_ObjFaninNum(pNet) && !Ver_ParseFormalNetsAreDriven(pNtk, pBundle->pNameFormal) ) // non-driven
                return pBundle;
    }
    return NULL;
}